

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QString * QJsonValueConstRef::concreteString(QJsonValueConstRef self,QString *defaultValue)

{
  long lVar1;
  QJsonValueConstRef r;
  const_reference pEVar2;
  QCborContainerPrivate *in_RDX;
  undefined8 extraout_RDX;
  QCborContainerPrivate *in_RSI;
  QList<QtCbor::Element> *in_RDI;
  long in_FS_OFFSET;
  QJsonValueConstRef r_00;
  qsizetype index;
  QCborContainerPrivate *d;
  QList<QtCbor::Element> *this;
  QCborContainerPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r._8_8_ = in_RDX;
  r.d = in_RSI;
  this = in_RDI;
  this_00 = in_RSI;
  QJsonPrivate::Value::container(r);
  r_00._8_8_ = extraout_RDX;
  r_00.d = in_RDX;
  QJsonPrivate::Value::indexHelper((Value *)in_RSI,r_00);
  pEVar2 = QList<QtCbor::Element>::at(this,(qsizetype)in_RDI);
  if (pEVar2->type == String) {
    QCborContainerPrivate::stringAt(this_00,(qsizetype)in_RDX);
  }
  else {
    QString::QString((QString *)this,(QString *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QJsonValueConstRef::concreteString(QJsonValueConstRef self, const QString &defaultValue)
{
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);
    if (d->elements.at(index).type != QCborValue::String)
        return defaultValue;
    return d->stringAt(index);
}